

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

uint32 BailOutRecord::BailOutFromLoopBodyInlinedCommon
                 (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,
                 uint32 bailOutOffset,void *returnAddress,BailOutKind bailOutKind,Var branchValue)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *src;
  ScriptFunction *function;
  ScriptFunction *pSStack_1e8;
  uint32 result;
  ScriptFunction *innerMostInlinee;
  BailOutReturnValue bailOutReturnValue;
  BailOutRecord *currentBailOutRecord;
  Var registerSaves [49];
  Var branchValue_local;
  BailOutKind bailOutKind_local;
  void *returnAddress_local;
  uint32 bailOutOffset_local;
  BailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  if (bailOutRecord->parent == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x4c7,"(bailOutRecord->parent != nullptr)",
                       "bailOutRecord->parent != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
  this = Js::ScriptContext::GetThreadContext(pSVar5);
  src = ThreadContext::GetBailOutRegisterSaveSpace(this);
  js_memcpy_s(&currentBailOutRecord,0x188,src,0x188);
  pSStack_1e8 = (ScriptFunction *)0x0;
  bailOutReturnValue._8_8_ = bailOutRecord;
  BailOutInlinedHelper
            (layout,(BailOutRecord **)&bailOutReturnValue.returnValueRegSlot,bailOutOffset,
             returnAddress,bailOutKind,&currentBailOutRecord,(BailOutReturnValue *)&innerMostInlinee
             ,&stack0xfffffffffffffe18,true,branchValue);
  pSVar5 = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
  SetHasBailedOutBit(bailOutRecord,pSVar5);
  uVar3 = BailOutFromLoopBodyHelper
                    (layout,(BailOutRecord *)bailOutReturnValue._8_8_,
                     *(uint32 *)(bailOutReturnValue._8_8_ + 0x34),bailOutKind,(Var)0x0,
                     &currentBailOutRecord,(BailOutReturnValue *)&innerMostInlinee);
  function = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ScheduleLoopBodyCodeGen
            (function,pSStack_1e8,(BailOutRecord *)bailOutReturnValue._8_8_,bailOutKind);
  return uVar3;
}

Assistant:

uint32
BailOutRecord::BailOutFromLoopBodyInlinedCommon(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
    uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var branchValue)
{
    Assert(bailOutRecord->parent != nullptr);
    // This isn't strictly necessary if there's no allocations on this path, but because such an
    // issue would be hard to notice and introduce some significant issues, we can do this copy.
    // The problem from not doing this and then doing an allocation before RestoreValues is that
    // the GC doesn't check the BailOutRegisterSaveSpace.
    Js::Var registerSaves[BailOutRegisterSaveSlotCount];
    js_memcpy_s(registerSaves, sizeof(registerSaves), (Js::Var *)layout->functionObject->GetScriptContext()->GetThreadContext()->GetBailOutRegisterSaveSpace(),
        sizeof(registerSaves));
    BailOutRecord const * currentBailOutRecord = bailOutRecord;
    BailOutReturnValue bailOutReturnValue;
    Js::ScriptFunction * innerMostInlinee = nullptr;
    BailOutInlinedHelper(layout, currentBailOutRecord, bailOutOffset, returnAddress, bailOutKind, registerSaves, &bailOutReturnValue, &innerMostInlinee, true, branchValue);
    SetHasBailedOutBit(bailOutRecord, layout->functionObject->GetScriptContext());
    uint32 result = BailOutFromLoopBodyHelper(layout, currentBailOutRecord, currentBailOutRecord->bailOutOffset,
        bailOutKind, nullptr, registerSaves, &bailOutReturnValue);
    ScheduleLoopBodyCodeGen(Js::VarTo<Js::ScriptFunction>(layout->functionObject), innerMostInlinee, currentBailOutRecord, bailOutKind);
    return result;
}